

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_CreateDestroy_Test::TestBody(ArenaTest_CreateDestroy_Test *this)

{
  TestAllTypes *this_00;
  TestAllTypes *this_01;
  ulong uVar1;
  pointer *__ptr;
  char *message;
  AssertionResult gtest_ar;
  Arena arena;
  TestAllTypes original;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_418;
  AssertHelper local_410;
  internal local_408 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  ThreadSafeArena local_3f8;
  TestAllTypes local_350;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_350,(Arena *)0x0);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&local_350);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_3f8);
  this_00 = (TestAllTypes *)Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)0x0);
  this_01 = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_3f8);
  proto2_unittest::TestAllTypes::CopyFrom(this_00,&local_350);
  proto2_unittest::TestAllTypes::CopyFrom(this_01,&local_350);
  uVar1 = (this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    proto2_unittest::TestAllTypes::~TestAllTypes(this_00);
    operator_delete(this_00,0x340);
  }
  uVar1 = (this_01->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    proto2_unittest::TestAllTypes::~TestAllTypes(this_01);
    operator_delete(this_01,0x340);
  }
  local_418._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       strlen(*(char **)((ulong)local_350.field_0._impl_.optional_string_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc));
  local_410.data_ =
       (AssertHelperData *)
       strlen(*(char **)((ulong)(this_01->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc));
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_408,"strlen(original.optional_string().c_str())",
             "strlen(arena_message->optional_string().c_str())",(unsigned_long *)&local_418,
             (unsigned_long *)&local_410);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_418);
    if (local_400 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_400->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x1a1,message);
    testing::internal::AssertHelper::operator=(&local_410,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    if (local_418._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_418._M_head_impl + 8))();
    }
  }
  if (local_400 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_400,local_400);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_3f8);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_350);
  return;
}

Assistant:

TEST(ArenaTest, CreateDestroy) {
  TestAllTypes original;
  TestUtil::SetAllFields(&original);

  // Test memory leak.
  Arena arena;
  TestAllTypes* heap_message = Arena::Create<TestAllTypes>(nullptr);
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);

  *heap_message = original;
  *arena_message = original;

  Arena::Destroy(heap_message);
  Arena::Destroy(arena_message);

  // The arena message should still exist.
  EXPECT_EQ(strlen(original.optional_string().c_str()),
            strlen(arena_message->optional_string().c_str()));
}